

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr __thiscall c4::yml::Tree::lookup_result::unresolved(lookup_result *this)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  csubstr cVar4;
  csubstr local_20;
  
  uVar1 = this->path_pos;
  if (uVar1 <= (this->path).len) {
    basic_substring<const_char>::basic_substring
              (&local_20,(this->path).str + uVar1,(this->path).len - uVar1);
    return local_20;
  }
  if ((s_error_flags & 1) != 0) {
    bVar3 = is_debugger_attached();
    if (bVar3) {
      pcVar2 = (code *)swi(3);
      cVar4 = (csubstr)(*pcVar2)();
      return cVar4;
    }
  }
  handle_error(0x1fe047,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1533,"first >= 0 && first <= len");
}

Assistant:

csubstr Tree::lookup_result::unresolved() const
{
    return path.sub(path_pos);
}